

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::dump(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
       *this,int indent)

{
  int in_EDX;
  string_t *in_RDI;
  stringstream ss;
  uint in_stack_0000012c;
  uint in_stack_00000130;
  bool in_stack_00000137;
  ostream *in_stack_00000138;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_00000140;
  stringstream local_1a0 [396];
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::stringstream::stringstream(local_1a0);
  if (local_14 < 0) {
    dump(in_stack_00000140,in_stack_00000138,in_stack_00000137,in_stack_00000130,in_stack_0000012c);
  }
  else {
    dump(in_stack_00000140,in_stack_00000138,in_stack_00000137,in_stack_00000130,in_stack_0000012c);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

string_t dump(const int indent = -1) const
    {
        std::stringstream ss;

        if (indent >= 0)
        {
            dump(ss, true, static_cast<unsigned int>(indent));
        }
        else
        {
            dump(ss, false, 0);
        }

        return ss.str();
    }